

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsStatus.cpp
# Opt level: O2

HighsStatus worseStatus(HighsStatus status0,HighsStatus status1)

{
  HighsStatus HVar1;
  
  HVar1 = (HighsStatus)(status1 == kWarning || status0 == kWarning);
  if (status1 == kError) {
    HVar1 = kError;
  }
  if (status0 == kError) {
    HVar1 = kError;
  }
  return HVar1;
}

Assistant:

HighsStatus worseStatus(const HighsStatus status0, const HighsStatus status1) {
  HighsStatus return_status = HighsStatus::kError;
  if (status0 == HighsStatus::kError || status1 == HighsStatus::kError)
    return_status = HighsStatus::kError;
  else if (status0 == HighsStatus::kWarning || status1 == HighsStatus::kWarning)
    return_status = HighsStatus::kWarning;
  else
    return_status = HighsStatus::kOk;
  return return_status;
}